

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O0

void __thiscall
TestParser_TestIfStmt_Test::~TestParser_TestIfStmt_Test(TestParser_TestIfStmt_Test *this)

{
  TestParser_TestIfStmt_Test *this_local;
  
  ~TestParser_TestIfStmt_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestParser, TestIfStmt){
    cout << R"(
            ---- test_ifstmt ----
            )" << endl;
    string buff = R"(if(1 >= 1){

                    }else{

                    }
                    if(0 == 0){

                    }
                    if(0 < 0){

                    }
                    if(19 > 18){

                    }
                    if(17 != 90){

                    }
                   )";
    Lexer* l = Lexer::New(buff);
    Parser* parser = Parser::New(l);
    auto program = parser->parseProgram();
    EXPECT_TRUE(!program->Stmts.empty());
    EXPECT_EQ((int)program->Stmts.size(), 5);
    cout << program << endl;
}